

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_27986c::writeReadYa
          (anon_unknown_dwarf_27986c *this,Box2i *dw,int tileSizeX,int tileSizeY,char *fileName,
          _func_void_Array2D<Imf_2_5::Rgba>_ptr_int_int *fillPixels)

{
  ulong yStride;
  ulong sizeX;
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  half *phVar11;
  undefined4 in_register_00000014;
  half *phVar12;
  long lVar13;
  long lVar14;
  float in_XMM2_Da;
  Array2D<Imf_2_5::Rgba> pixels1;
  Array2D<Imf_2_5::Rgba> pixels2;
  int local_78;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  iVar3 = *(int *)(this + 8);
  iVar4 = *(int *)this;
  yStride = ((long)iVar3 - (long)iVar4) + 1;
  iVar5 = *(int *)(this + 0xc);
  iVar6 = *(int *)(this + 4);
  sizeX = ((long)iVar5 - (long)iVar6) + 1;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D(&pixels1,sizeX,yStride);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D(&pixels2,sizeX,yStride);
  (*(code *)CONCAT44(in_register_00000014,tileSizeX))
            (&pixels1,yStride & 0xffffffff,sizeX & 0xffffffff);
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  local_38 = 0;
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            (&out,(char *)dw,0x13,0x1b,ONE_LEVEL,ROUND_DOWN,(Box2i *)this,(Box2i *)this,WRITE_YA,1.0
             ,(V2f)0x3f800000,in_XMM2_Da,(LineOrder)&local_38,NO_COMPRESSION,3);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer
            (&out,pixels1._data + (-(long)*(int *)(this + 4) * pixels1._sizeY - (long)*(int *)this),
             1,yStride);
  iVar8 = Imf_2_5::TiledRgbaOutputFile::numXTiles(&out,0);
  iVar9 = Imf_2_5::TiledRgbaOutputFile::numYTiles(&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles(&out,0,iVar8 + -1,0,iVar9 + -1,0);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::flush();
  iVar8 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,(char *)dw,iVar8);
  Imf_2_5::TiledRgbaInputFile::setFrameBuffer
            ((TiledRgbaInputFile *)&out,
             pixels2._data + (-(long)*(int *)(this + 4) * pixels2._sizeY - (long)*(int *)this),1,
             yStride);
  iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&out,0);
  iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&out,0);
  Imf_2_5::TiledRgbaInputFile::readTiles((TiledRgbaInputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
  poVar10 = std::operator<<((ostream *)&std::cout,"comparing");
  std::endl<char,std::char_traits<char>>(poVar10);
  local_78 = (int)((long)iVar3 - (long)iVar4);
  phVar12 = &(pixels2._data)->a;
  phVar11 = &(pixels1._data)->a;
  lVar13 = 0;
  do {
    if ((int)((long)iVar5 - (long)iVar6) < lVar13) {
      remove((char *)dw);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&pixels2);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&pixels1);
      return;
    }
    lVar14 = 0;
    while (lVar14 <= local_78) {
      fVar2 = *(float *)((long)&half::_toFloat + (ulong)phVar11[lVar14 * 4 + -3]._h * 4);
      pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar12[lVar14 * 4 + -3]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p1.r == p2.r",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                      ,0xa4,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar2 = *(float *)((long)&half::_toFloat + (ulong)phVar11[lVar14 * 4 + -2]._h * 4);
      pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar12[lVar14 * 4 + -2]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p1.g == p2.g",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                      ,0xa5,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar2 = *(float *)((long)&half::_toFloat + (ulong)phVar11[lVar14 * 4 + -1]._h * 4);
      pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar12[lVar14 * 4 + -1]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p1.b == p2.b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                      ,0xa6,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar2 = *(float *)((long)&half::_toFloat + (ulong)phVar11[lVar14 * 4]._h * 4);
      lVar7 = lVar14 * 4;
      lVar14 = lVar14 + 1;
      pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar12[lVar7]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p1.a == p2.a",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                      ,0xa7,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
    }
    lVar13 = lVar13 + 1;
    phVar12 = phVar12 + pixels2._sizeY * 4;
    phVar11 = phVar11 + pixels1._sizeY * 4;
  } while( true );
}

Assistant:

void
writeReadYa (Box2i &dw,
	     int tileSizeX,
	     int tileSizeY,
	     const char fileName[],
	     void (* fillPixels) (Array2D<Rgba> &pixels, int w, int h))
{
    int w = dw.max.x - dw.min.x + 1;
    int h = dw.max.y - dw.min.y + 1;
    Array2D <Rgba> pixels1 (h, w);
    Array2D <Rgba> pixels2 (h, w);

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
	TiledRgbaOutputFile out (fileName,
				 tileSizeX, tileSizeY,
				 ONE_LEVEL, ROUND_DOWN,
				 dw, dw,
				 WRITE_YA);

	out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writeTiles (0, out.numXTiles() - 1,  0, out.numYTiles() - 1);
    }

    cout << "reading " << flush;

    {
	TiledRgbaInputFile in (fileName);

	in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);
        in.readTiles (0, in.numXTiles() - 1, 0, in.numYTiles() - 1);
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    const Rgba &p1 = pixels1[y][x];
	    const Rgba &p2 = pixels2[y][x];

	    assert (p1.r == p2.r);
	    assert (p1.g == p2.g);
	    assert (p1.b == p2.b);
	    assert (p1.a == p2.a);
	}
    }

    remove (fileName);
}